

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void cmprintf(cm_printf_type type,size_t test_number,char *test_name,char *error_message)

{
  cm_message_output cVar1;
  char *__ptr;
  char *pcVar2;
  char *pcVar3;
  
  cVar1 = cm_get_output();
  if (cVar1 != CM_OUTPUT_TAP) {
    if (cVar1 == CM_OUTPUT_SUBUNIT) {
      (*(code *)(&DAT_00108490 + *(int *)(&DAT_00108490 + (ulong)type * 4)))();
      return;
    }
    if (cVar1 != CM_OUTPUT_STDOUT) {
      return;
    }
    (*(code *)(&DAT_001084a4 + *(int *)(&DAT_001084a4 + (ulong)type * 4)))();
    return;
  }
  switch(type) {
  case PRINTF_TEST_SUCCESS:
    pcVar3 = "ok %u - %s\n";
    break;
  case PRINTF_TEST_FAILURE:
    print_message("not ok %u - %s\n",test_number & 0xffffffff,test_name);
    if (error_message == (char *)0x0) {
      return;
    }
    __ptr = strdup(error_message);
    pcVar3 = __ptr;
    if (__ptr == (char *)0x0) {
      return;
    }
    do {
      if (*pcVar3 == '\0') break;
      pcVar2 = strchr(pcVar3,10);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      print_message("# %s\n",pcVar3);
      pcVar3 = pcVar2 + 1;
    } while (pcVar2 != (char *)0x0);
    free(__ptr);
    return;
  case PRINTF_TEST_ERROR:
    print_message("not ok %u - %s %s\n",test_number & 0xffffffff,test_name,error_message);
    return;
  case PRINTF_TEST_SKIPPED:
    pcVar3 = "not ok %u # SKIP %s\n";
    break;
  default:
    return;
  }
  print_message(pcVar3,test_number & 0xffffffff,test_name);
  return;
}

Assistant:

static void cmprintf(enum cm_printf_type type,
                     size_t test_number,
                     const char *test_name,
                     const char *error_message)
{
    enum cm_message_output output;

    output = cm_get_output();

    switch (output) {
    case CM_OUTPUT_STDOUT:
        cmprintf_standard(type, test_name, error_message);
        break;
    case CM_OUTPUT_SUBUNIT:
        cmprintf_subunit(type, test_name, error_message);
        break;
    case CM_OUTPUT_TAP:
        cmprintf_tap(type, test_number, test_name, error_message);
        break;
    case CM_OUTPUT_XML:
        break;
    }
}